

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void update_miscstats(void)

{
  undefined1 local_a8 [8];
  rusage ru;
  timeval timev;
  
  getrusage(RUSAGE_SELF,(rusage *)local_a8);
  MiscStats->totaltime = local_a8._0_4_ * 1000 + (int)(ru.ru_utime.tv_sec / 1000);
  MiscStats->swapwaittime = (int)ru.ru_utime.tv_usec * 1000 + (int)(ru.ru_stime.tv_sec / 1000);
  MiscStats->pagefaults = ru.field_5.ru_isrss._0_4_ + ru.field_6.ru_minflt._0_4_;
  MiscStats->swapwrites = ru.field_6.ru_minflt._0_4_;
  MiscStats->diskiotime = 0;
  MiscStats->diskops = ru.field_8.ru_nswap._0_4_ + ru.field_9.ru_inblock._0_4_;
  gettimeofday((timeval *)&ru.field_15,(__timezone_ptr_t)0x0);
  MiscStats->secondsclock = ru.field_15.ru_nivcsw._0_4_ + 0x81c94b00;
  MiscStats->secondstmp = ru.field_15.ru_nivcsw._0_4_ + 0x81c94b00;
  return;
}

Assistant:

void update_miscstats(void) {
#ifdef DOS
  struct dostime_t dtm; /* holds DOS time, so we can get .01 secs */
  _dos_gettime(&dtm);

  MiscStats->totaltime = (time(0) * 1000) + (10 * dtm.hsecond);
  MiscStats->swapwaittime = 0;
  MiscStats->pagefaults = 0;
  MiscStats->swapwrites = 0;
  MiscStats->diskiotime = 0; /* ?? not available ?? */
  MiscStats->diskops = 0;
  MiscStats->secondstmp = MiscStats->secondsclock = (time(0) + UNIX_ALTO_TIME_DIFF);
#elif defined(MAIKO_OS_EMSCRIPTEN)
  /* Emscripten does not provide getrusage() functionality */
  struct timeval timev;

  MiscStats->totaltime = gettime(0) - MiscStats->starttime;
  MiscStats->swapwaittime = 0;
  MiscStats->pagefaults = 0;
  MiscStats->swapwrites = 0;
  MiscStats->diskiotime = 0;
  MiscStats->diskops = 0;

  gettimeofday(&timev, NULL);
  MiscStats->secondstmp = MiscStats->secondsclock = (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#else
  struct timeval timev;
  struct rusage ru;

  getrusage(RUSAGE_SELF, &ru);

  MiscStats->totaltime = ru.ru_utime.tv_sec * 1000 + ru.ru_utime.tv_usec / 1000;
  MiscStats->swapwaittime = ru.ru_stime.tv_sec * 1000 + ru.ru_stime.tv_usec / 1000;
  MiscStats->pagefaults = ru.ru_minflt + ru.ru_majflt;
  MiscStats->swapwrites = ru.ru_majflt;
  MiscStats->diskiotime = 0; /* ?? not available ?? */
  MiscStats->diskops = ru.ru_inblock + ru.ru_oublock;
  gettimeofday(&timev, NULL);
  MiscStats->secondstmp = MiscStats->secondsclock = (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#endif /* DOS */
}